

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::CollectSideEffectsForTarget
          (cmComputeTargetDepends *this,set<int,_std::less<int>,_std::allocator<int>_> *visited,
          int depender_index)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pTVar3;
  pointer pcVar4;
  pointer pTVar5;
  _Base_ptr p_Var6;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_00;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  cmGraphEdge *edge;
  pointer pcVar9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *sideEffects;
  int local_44;
  pointer local_40;
  pointer local_38;
  
  p_Var6 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      if (depender_index <= (int)p_Var6[1]._M_color) {
        p_Var8 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < depender_index];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= depender_index)) {
      return;
    }
  }
  pTVar3 = (this->SideEffects).
           super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar5 = pTVar3 + depender_index;
  local_44 = depender_index;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)visited,
             &local_44);
  local_38 = pTVar5;
  cmGeneratorTarget::AppendCustomCommandSideEffects
            ((this->Targets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start[local_44],&pTVar5->CustomCommandSideEffects);
  sideEffects = &pTVar3[depender_index].LanguageSideEffects;
  cmGeneratorTarget::AppendLanguageSideEffects
            ((this->Targets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start[local_44],sideEffects);
  pcVar4 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar9 = *(pointer *)
            &pcVar4[local_44].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  local_40 = *(pointer *)
              ((long)&pcVar4[local_44].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
  if (pcVar9 != local_40) {
    do {
      CollectSideEffectsForTarget(this,visited,pcVar9->Dest);
      iVar2 = pcVar9->Dest;
      pTVar5 = (this->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)local_38,
                 *(_Base_ptr *)((long)&pTVar5[iVar2].CustomCommandSideEffects._M_t._M_impl + 0x18),
                 (_Base_ptr)((long)&pTVar5[iVar2].CustomCommandSideEffects._M_t._M_impl + 8));
      for (p_Var7 = *(_Base_ptr *)((long)&pTVar5[iVar2].LanguageSideEffects._M_t._M_impl + 0x18);
          p_Var7 != (_Rb_tree_node_base *)
                    ((long)&pTVar5[iVar2].LanguageSideEffects._M_t._M_impl + 8U);
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        this_00 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                     ::operator[](sideEffects,(key_type *)(p_Var7 + 1));
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                  (this_00,p_Var7[2]._M_right,
                   (_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)&p_Var7[2]._M_parent);
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != local_40);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffectsForTarget(
  std::set<int>& visited, int depender_index)
{
  if (!visited.count(depender_index)) {
    auto& se = this->SideEffects[depender_index];
    visited.insert(depender_index);
    this->Targets[depender_index]->AppendCustomCommandSideEffects(
      se.CustomCommandSideEffects);
    this->Targets[depender_index]->AppendLanguageSideEffects(
      se.LanguageSideEffects);

    for (auto const& edge : this->InitialGraph[depender_index]) {
      this->CollectSideEffectsForTarget(visited, edge);
      auto const& dse = this->SideEffects[edge];
      se.CustomCommandSideEffects.insert(dse.CustomCommandSideEffects.cbegin(),
                                         dse.CustomCommandSideEffects.cend());
      for (auto const& it : dse.LanguageSideEffects) {
        se.LanguageSideEffects[it.first].insert(it.second.cbegin(),
                                                it.second.cend());
      }
    }
  }
}